

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O3

shared_ptr<HawkTracer::client::CallGraph::TreeNode> __thiscall
HawkTracer::client::CallGraph::_add_new_call
          (CallGraph *this,NodeData *node_data,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *parent,
          vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
          *calls)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  size_t sVar3;
  pointer ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined1 *__s2;
  int iVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  long *plVar9;
  long *plVar10;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *in_R8;
  string *psVar11;
  long lVar12;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> sVar13;
  string label;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [20];
  int local_4c;
  long *local_48;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  *local_40;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *local_38;
  
  local_70 = local_60;
  peVar2 = (parent->
           super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_40 = calls;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,peVar2,
             (long)&((parent->
                     super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar2);
  sVar3 = local_68;
  __s2 = local_70;
  plVar10 = *(long **)in_R8;
  local_48 = *(long **)(in_R8 + 8);
  lVar7 = (long)local_48 - (long)plVar10;
  lVar12 = (lVar7 >> 3) * -0x5555555555555555 >> 2;
  local_38 = in_R8;
  if (0 < lVar12) {
    plVar9 = plVar10 + lVar12 * 0xc;
    lVar12 = lVar12 + 1;
    plVar10 = plVar10 + 6;
    do {
      psVar11 = (string *)plVar10[-6];
      if ((*(size_t *)(psVar11 + 8) == sVar3) &&
         ((sVar3 == 0 || (iVar6 = bcmp(*(void **)psVar11,__s2,sVar3), iVar6 == 0)))) {
        plVar10 = plVar10 + -6;
        goto LAB_001116d5;
      }
      psVar11 = (string *)plVar10[-3];
      if ((*(size_t *)(psVar11 + 8) == sVar3) &&
         ((sVar3 == 0 || (iVar6 = bcmp(*(void **)psVar11,__s2,sVar3), iVar6 == 0)))) {
        plVar10 = plVar10 + -3;
        goto LAB_001116d5;
      }
      psVar11 = (string *)*plVar10;
      if ((*(size_t *)(psVar11 + 8) == sVar3) &&
         ((sVar3 == 0 || (iVar6 = bcmp(*(void **)psVar11,__s2,sVar3), iVar6 == 0))))
      goto LAB_001116d5;
      psVar11 = (string *)plVar10[3];
      if ((*(size_t *)(psVar11 + 8) == sVar3) &&
         ((sVar3 == 0 || (iVar6 = bcmp(*(void **)psVar11,__s2,sVar3), iVar6 == 0)))) {
        plVar10 = plVar10 + 3;
        goto LAB_001116d5;
      }
      lVar12 = lVar12 + -1;
      plVar10 = plVar10 + 0xc;
    } while (1 < lVar12);
    lVar7 = (long)local_48 - (long)plVar9;
    plVar10 = plVar9;
  }
  lVar7 = (lVar7 >> 3) * -0x5555555555555555;
  if (lVar7 == 3) {
    psVar11 = (string *)*plVar10;
    sVar3 = *(size_t *)(psVar11 + 8);
    if ((sVar3 != local_68) ||
       ((sVar3 != 0 && (iVar6 = bcmp(*(void **)psVar11,local_70,sVar3), iVar6 != 0)))) {
      plVar10 = plVar10 + 3;
      goto LAB_0011166f;
    }
LAB_001116d5:
    if (plVar10 != local_48) {
      *(long *)(psVar11 + 0x30) =
           (long)parent[2].
                 super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi +
           (*(long *)(psVar11 + 0x30) -
           (long)parent[2].
                 super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::__cxx11::string::_M_assign(psVar11);
      p_Var5 = parent[2].
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      *(element_type **)(psVar11 + 0x20) =
           parent[2].
           super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar11 + 0x28) = p_Var5;
      *(int *)(plVar10 + 2) = (int)plVar10[2] + 1;
      (this->_root_calls).
      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar10;
      ppVar4 = (pointer)plVar10[1];
      (this->_root_calls).
      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
      _Var8._M_pi = extraout_RDX;
      if (ppVar4 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(ppVar4->first).
                    super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &(ppVar4->first).
                    super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      goto LAB_00111779;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0011166f:
      psVar11 = (string *)*plVar10;
      if ((*(size_t *)(psVar11 + 8) != local_68) ||
         ((local_68 != 0 && (iVar6 = bcmp(*(void **)psVar11,local_70,local_68), iVar6 != 0)))) {
        plVar10 = plVar10 + 3;
        goto LAB_00111696;
      }
      goto LAB_001116d5;
    }
    if (lVar7 == 1) {
LAB_00111696:
      psVar11 = (string *)*plVar10;
      if ((*(size_t *)(psVar11 + 8) == local_68) &&
         ((local_68 == 0 || (iVar6 = bcmp(*(void **)psVar11,local_70,local_68), iVar6 == 0))))
      goto LAB_001116d5;
    }
  }
  (this->_root_calls).
  super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HawkTracer::client::CallGraph::TreeNode,std::allocator<HawkTracer::client::CallGraph::TreeNode>,HawkTracer::client::CallGraph::NodeData_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->_root_calls).
              super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(TreeNode **)this,
             (allocator<HawkTracer::client::CallGraph::TreeNode> *)&local_4c,(NodeData *)parent);
  ppVar4 = (this->_root_calls).
           super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)&ppVar4[3].second =
       (local_40->
       super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(ppVar4 + 4),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(local_40->
              super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_finish);
  local_4c = 1;
  std::
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,int>
            (local_38,(shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)this,&local_4c);
  _Var8._M_pi = extraout_RDX_00;
LAB_00111779:
  if (local_70 != local_60) {
    operator_delete(local_70);
    _Var8._M_pi = extraout_RDX_01;
  }
  sVar13.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  sVar13.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<HawkTracer::client::CallGraph::TreeNode>)
         sVar13.
         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CallGraph::TreeNode> CallGraph::_add_new_call(const NodeData& node_data,
                                                              const std::shared_ptr<TreeNode>& parent,
                                                              std::vector<std::pair<std::shared_ptr<TreeNode>, int>>& calls)
{
    std::string label = node_data.label;
    auto call = std::find_if(calls.begin(), calls.end(),
            [&label](const std::pair<std::shared_ptr<TreeNode>, int>& call) {
                return call.first->data.label == label;
            });
    if (call != calls.end())
    {
        call->first->total_duration += node_data.get_duration();
        call->first->data = node_data;
        ++call->second;

        return call->first;
    }
    else
    {
        std::shared_ptr<TreeNode> event_node = std::make_shared<TreeNode>(node_data);
        event_node->parent = parent;
        calls.emplace_back(event_node, 1);

        return event_node;
    }
}